

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

endpoint __thiscall booster::aio::basic_socket::local_endpoint(basic_socket *this)

{
  bool bVar1;
  undefined8 uVar2;
  system_error *in_RSI;
  copy_ptr<booster::aio::endpoint::data> in_RDI;
  error_code *in_stack_00000030;
  basic_socket *in_stack_00000038;
  error_code e;
  endpoint *ep;
  error_code in_stack_ffffffffffffffb8;
  error_code local_20 [2];
  
  std::error_code::error_code((error_code *)in_RDI.ptr_);
  local_endpoint(in_stack_00000038,in_stack_00000030);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x40);
    system::system_error::system_error(in_RSI,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return (endpoint)(copy_ptr<booster::aio::endpoint::data>)in_RDI.ptr_;
}

Assistant:

endpoint basic_socket::local_endpoint()
{
	system::error_code e;
	endpoint ep=local_endpoint(e);
	if(e) throw system::system_error(e);
	return ep;
}